

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::Demangle(char *mangled,char *out,size_t out_size)

{
  bool bVar1;
  size_t in_RDX;
  char *in_RSI;
  char *in_RDI;
  State state;
  size_t in_stack_00000150;
  char *in_stack_00000158;
  char *in_stack_00000160;
  bool local_51;
  State local_50;
  bool local_1;
  
  if ((*in_RDI == '_') && (in_RDI[1] == 'R')) {
    local_1 = DemangleRustSymbolEncoding(in_stack_00000160,in_stack_00000158,in_stack_00000150);
  }
  else {
    InitState(&local_50,in_RDI,in_RSI,in_RDX);
    bVar1 = ParseTopLevelMangledName((State *)state.mangled_begin);
    local_51 = false;
    if (bVar1) {
      bVar1 = Overflowed(&local_50);
      local_51 = false;
      if (!bVar1) {
        local_51 = 0 < local_50.parse_state.out_cur_idx;
      }
    }
    local_1 = local_51;
  }
  return local_1;
}

Assistant:

bool Demangle(const char* mangled, char* out, size_t out_size) {
  if (mangled[0] == '_' && mangled[1] == 'R') {
    return DemangleRustSymbolEncoding(mangled, out, out_size);
  }

  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !Overflowed(&state) &&
         state.parse_state.out_cur_idx > 0;
}